

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_boundary.cpp
# Opt level: O2

void word_boundary(void)

{
  ostream *poVar1;
  long lVar2;
  allocator local_471;
  generator g;
  allocator local_468 [36];
  allocator local_444;
  allocator local_443;
  allocator local_442;
  allocator local_441;
  string local_440 [8];
  string local_438 [8];
  string local_430 [8];
  string local_428 [8];
  string local_420 [8];
  string local_418 [8];
  string local_410 [8];
  string local_408 [8];
  string local_400 [8];
  int none1 [9];
  int word1 [9];
  int num1 [9];
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined4 local_348;
  int none3 [8];
  string all2 [1];
  int kana1 [9];
  int word3 [8];
  int zero [25];
  string all3 [8];
  string all1 [9];
  
  booster::locale::generator::generator(&g);
  std::__cxx11::string::string((string *)all1,"10",(allocator *)all3);
  std::__cxx11::string::string((string *)(all1 + 1)," ",(allocator *)zero);
  std::__cxx11::string::string((string *)(all1 + 2),"Hello",(allocator *)none1);
  std::__cxx11::string::string((string *)(all1 + 3)," ",(allocator *)num1);
  std::__cxx11::string::string((string *)(all1 + 4),"Windows7",(allocator *)word1);
  std::__cxx11::string::string((string *)(all1 + 5)," ",(allocator *)kana1);
  std::__cxx11::string::string((string *)(all1 + 6),anon_var_dwarf_12a47,(allocator *)&local_368);
  std::__cxx11::string::string((string *)(all1 + 7),anon_var_dwarf_12a61,(allocator *)all2);
  std::__cxx11::string::string((string *)(all1 + 8),"",(allocator *)none3);
  none1[6] = 0;
  none1[7] = 0;
  none1[8] = 0;
  local_348 = 1;
  none1[0] = 0;
  none1[1] = 1;
  none1[2] = 0;
  none1[3] = 1;
  none1[4] = 0;
  none1[5] = 1;
  num1[2] = 0;
  num1[3] = 0;
  num1[6] = 0;
  num1[7] = 0;
  num1[8] = 0;
  num1[0] = 1;
  num1[1] = 0;
  num1[4] = 1;
  num1[5] = 0;
  word1[0] = 0;
  word1[1] = 0;
  word1[6] = 0;
  word1[7] = 0;
  word1[8] = 0;
  word1[2] = 1;
  word1[3] = 0;
  word1[4] = 1;
  word1[5] = 0;
  kana1[8] = 0;
  kana1[4] = 0;
  kana1[5] = 0;
  kana1[6] = 0;
  kana1[7] = 0;
  kana1[0] = 0;
  kana1[1] = 0;
  kana1[2] = 0;
  kana1[3] = 0;
  local_358 = 0;
  local_368 = 0;
  uStack_360 = 0;
  uStack_350 = 0x100000001;
  zero[0x14] = 0;
  zero[0x15] = 0;
  zero[0x16] = 0;
  zero[0x17] = 0;
  zero[0x10] = 0;
  zero[0x11] = 0;
  zero[0x12] = 0;
  zero[0x13] = 0;
  zero[0xc] = 0;
  zero[0xd] = 0;
  zero[0xe] = 0;
  zero[0xf] = 0;
  zero[8] = 0;
  zero[9] = 0;
  zero[10] = 0;
  zero[0xb] = 0;
  zero[4] = 0;
  zero[5] = 0;
  zero[6] = 0;
  zero[7] = 0;
  zero[0] = 0;
  zero[1] = 0;
  zero[2] = 0;
  zero[3] = 0;
  zero[0x18] = 0;
  std::__cxx11::string::string((string *)all2,"",(allocator *)all3);
  std::__cxx11::string::string((string *)all3," ",(allocator *)none3);
  std::__cxx11::string::string((string *)(all3 + 1)," ",(allocator *)word3);
  std::__cxx11::string::string((string *)(all3 + 2),"Hello",local_468);
  std::__cxx11::string::string((string *)(all3 + 3),",",&local_471);
  std::__cxx11::string::string((string *)(all3 + 4),"World",&local_441);
  std::__cxx11::string::string((string *)(all3 + 5),"!",&local_442);
  std::__cxx11::string::string((string *)(all3 + 6)," ",&local_443);
  std::__cxx11::string::string((string *)(all3 + 7),"",&local_444);
  none3[4] = 0;
  none3[5] = 1;
  none3[6] = 1;
  none3[7] = 0;
  none3[0] = 1;
  none3[1] = 1;
  none3[2] = 0;
  none3[3] = 1;
  word3[4] = 1;
  word3[5] = 0;
  word3[6] = 0;
  word3[7] = 0;
  word3[0] = 0;
  word3[1] = 0;
  word3[2] = 1;
  word3[3] = 0;
  poVar1 = std::operator<<((ostream *)&std::cout," char UTF-8");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::string((string *)local_468,"ja_JP.UTF-8",&local_471);
  booster::locale::generator::generate(local_400);
  run_word<char>(all1,none1,num1,word1,kana1,(int *)&local_368,(locale *)local_400,word);
  std::locale::~locale((locale *)local_400);
  std::__cxx11::string::~string((string *)local_468);
  std::__cxx11::string::string((string *)local_468,"en_US.UTF-8",&local_471);
  booster::locale::generator::generate(local_408);
  run_word<char>(all2,zero,zero,zero,zero,zero,(locale *)local_408,word);
  std::locale::~locale((locale *)local_408);
  std::__cxx11::string::~string((string *)local_468);
  std::__cxx11::string::string((string *)local_468,"en_US.UTF-8",&local_471);
  booster::locale::generator::generate(local_410);
  run_word<char>(all3,none3,zero,word3,zero,zero,(locale *)local_410,word);
  std::locale::~locale((locale *)local_410);
  std::__cxx11::string::~string((string *)local_468);
  poVar1 = std::operator<<((ostream *)&std::cout," char Shift-JIS");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::string((string *)local_468,"ja_JP.Shift-JIS",&local_471);
  booster::locale::generator::generate(local_418);
  run_word<char>(all1,none1,num1,word1,kana1,(int *)&local_368,(locale *)local_418,word);
  std::locale::~locale((locale *)local_418);
  std::__cxx11::string::~string((string *)local_468);
  std::__cxx11::string::string((string *)local_468,"ja_JP.Shift-JIS",&local_471);
  booster::locale::generator::generate(local_420);
  run_word<char>(all2,zero,zero,zero,zero,zero,(locale *)local_420,word);
  std::locale::~locale((locale *)local_420);
  std::__cxx11::string::~string((string *)local_468);
  std::__cxx11::string::string((string *)local_468,"ja_JP.Shift-JIS",&local_471);
  booster::locale::generator::generate(local_428);
  run_word<char>(all3,none3,zero,word3,zero,zero,(locale *)local_428,word);
  std::locale::~locale((locale *)local_428);
  std::__cxx11::string::~string((string *)local_468);
  poVar1 = std::operator<<((ostream *)&std::cout," wchar_t");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::string((string *)local_468,"ja_JP.UTF-8",&local_471);
  booster::locale::generator::generate(local_430);
  run_word<wchar_t>(all1,none1,num1,word1,kana1,(int *)&local_368,(locale *)local_430,word);
  std::locale::~locale((locale *)local_430);
  std::__cxx11::string::~string((string *)local_468);
  std::__cxx11::string::string((string *)local_468,"en_US.UTF-8",&local_471);
  booster::locale::generator::generate(local_438);
  run_word<wchar_t>(all2,zero,zero,zero,zero,zero,(locale *)local_438,word);
  std::locale::~locale((locale *)local_438);
  std::__cxx11::string::~string((string *)local_468);
  std::__cxx11::string::string((string *)local_468,"en_US.UTF-8",&local_471);
  booster::locale::generator::generate(local_440);
  run_word<wchar_t>(all3,none3,zero,word3,zero,zero,(locale *)local_440,word);
  std::locale::~locale((locale *)local_440);
  std::__cxx11::string::~string((string *)local_468);
  lVar2 = 0xe0;
  do {
    std::__cxx11::string::~string((string *)((long)&all3[0]._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  std::__cxx11::string::~string((string *)all2);
  lVar2 = 0x100;
  do {
    std::__cxx11::string::~string((string *)((long)&all1[0]._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  booster::locale::generator::~generator(&g);
  return;
}

Assistant:

void word_boundary()
{
    booster::locale::generator g;
    //std::string all1[]={"10"," ","Hello"," ","Windows7"," ","平仮名","ひらがな","ヒラガナ",""};
    //std::string all1[]={"10"," ","Hello"," ","Windows7"," ","平仮名","ひん","アヒル",""};
    std::string all1[]={"10"," ","Hello"," ","Windows7"," ","平仮名","アヒル",""};
    int        none1[]={ 0,   1,      0,  1,         0,   1,      0,         0,          0};
    int         num1[]={ 1,   0,      0,  0,         1,   0,      0 ,        0 ,         0};
    int        word1[]={ 0,   0,      1,  0,         1,   0,      0 ,        0 ,         0};
#if U_ICU_VERSION_MAJOR_NUM >= 50
    int        kana1[]={ 0,   0,      0,  0,         0,   0,      0,         0 ,         0}; 
    int        ideo1[]={ 0,   0,      0,  0,         0,   0,      1,         1 ,         1}; 
#else
    int        kana1[]={ 0,   0,      0,  0,         0,   0,      0,         1 ,         1}; 
    int        ideo1[]={ 0,   0,      0,  0,         0,   0,      1,         0 ,         0}; 
#endif


    int zero[25]={0};
    std::string all2[]={""};

    std::string all3[]={" "," ","Hello",",","World","!"," ",""};
    int        none3[]={ 1,  1,      0,  1,      0,   1,  1, 0};
    int        word3[]={ 0,  0,      1,  0,      1,   0,  0, 0};

    std::cout << " char UTF-8" << std::endl;
    run_word<char>(all1,none1,num1,word1,kana1,ideo1,g("ja_JP.UTF-8"));
    run_word<char>(all2,zero,zero,zero,zero,zero,g("en_US.UTF-8"));
    run_word<char>(all3,none3,zero,word3,zero,zero,g("en_US.UTF-8"));

    std::cout << " char Shift-JIS" << std::endl;
    run_word<char>(all1,none1,num1,word1,kana1,ideo1,g("ja_JP.Shift-JIS"));
    run_word<char>(all2,zero,zero,zero,zero,zero,g("ja_JP.Shift-JIS"));
    run_word<char>(all3,none3,zero,word3,zero,zero,g("ja_JP.Shift-JIS"));

    std::cout << " wchar_t"<<std::endl;
    run_word<wchar_t>(all1,none1,num1,word1,kana1,ideo1,g("ja_JP.UTF-8"));
    run_word<wchar_t>(all2,zero,zero,zero,zero,zero,g("en_US.UTF-8"));
    run_word<wchar_t>(all3,none3,zero,word3,zero,zero,g("en_US.UTF-8"));

    #ifdef BOOSTER_HAS_CHAR16_T
    std::cout << " char16_t"<<std::endl;
    run_word<char16_t>(all1,none1,num1,word1,kana1,ideo1,g("ja_JP.UTF-8"));
    run_word<char16_t>(all2,zero,zero,zero,zero,zero,g("en_US.UTF-8"));
    run_word<char16_t>(all3,none3,zero,word3,zero,zero,g("en_US.UTF-8"));
    #endif 

    #ifdef BOOSTER_HAS_CHAR32_T
    std::cout << " char32_t"<<std::endl;
    run_word<char32_t>(all1,none1,num1,word1,kana1,ideo1,g("ja_JP.UTF-8"));
    run_word<char32_t>(all2,zero,zero,zero,zero,zero,g("en_US.UTF-8"));
    run_word<char32_t>(all3,none3,zero,word3,zero,zero,g("en_US.UTF-8"));
    #endif 
}